

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-wilderness.c
# Opt level: O0

_Bool verify_level(chunk_conflict *c)

{
  loc_conflict grid_00;
  loc_conflict grid_01;
  loc_conflict grid_02;
  loc_conflict grid_03;
  loc_conflict grid_04;
  _Bool _Var1;
  square_conflict *psVar2;
  monster *pmVar3;
  object *poVar4;
  char *local_50;
  char *title;
  wchar_t wStack_40;
  loc grid;
  wchar_t broken_obj;
  wchar_t broken_mon;
  wchar_t broken_bnd;
  loc last_bad_obj;
  loc last_bad_mon;
  loc last_bad_bnd;
  chunk_conflict *c_local;
  
  last_bad_mon = loc(0,0);
  last_bad_obj = loc(0,0);
  _broken_mon = (loc_conflict)loc(0,0);
  broken_obj = L'\0';
  grid.y = 0;
  grid.x = 0;
  for (wStack_40 = L'\0'; wStack_40 < c->height; wStack_40 = wStack_40 + L'\x01') {
    for (title._4_4_ = L'\0'; title._4_4_ < c->width; title._4_4_ = title._4_4_ + L'\x01') {
      if (((((wStack_40 == L'\0') || (title._4_4_ == L'\0')) ||
           (wStack_40 == c->height + L'\xffffffff')) || (title._4_4_ == c->width + L'\xffffffff'))
         && (grid_00.y = wStack_40, grid_00.x = title._4_4_, psVar2 = square((chunk *)c,grid_00),
            (uint)psVar2->feat != FEAT_PERM)) {
        broken_obj = broken_obj + L'\x01';
        last_bad_mon.y = wStack_40;
        last_bad_mon.x = title._4_4_;
      }
      grid_01.y = wStack_40;
      grid_01.x = title._4_4_;
      pmVar3 = square_monster((chunk *)c,grid_01);
      if ((pmVar3 != (monster *)0x0) &&
         (grid_02.y = wStack_40, grid_02.x = title._4_4_,
         _Var1 = square_is_monster_walkable((chunk *)c,grid_02), !_Var1)) {
        grid.y = grid.y + 1;
        last_bad_obj.y = wStack_40;
        last_bad_obj.x = title._4_4_;
      }
      grid_03.y = wStack_40;
      grid_03.x = title._4_4_;
      poVar4 = square_object((chunk *)c,grid_03);
      if ((poVar4 != (object *)0x0) &&
         (grid_04.y = wStack_40, grid_04.x = title._4_4_,
         _Var1 = square_isobjectholding((chunk *)c,grid_04), !_Var1)) {
        grid.x = grid.x + 1;
        unique0x100001c4 = wStack_40;
        broken_mon = title._4_4_;
      }
    }
  }
  if (((broken_obj == L'\0') && (grid.y == 0)) && (grid.x == 0)) {
    c_local._7_1_ = true;
  }
  else {
    if (broken_obj == L'\0') {
      if (grid.y == 0) {
        psVar2 = square((chunk *)c,_broken_mon);
        local_50 = format("Broken Object:  %d Embedded in Terrain; Last at (x=%d,y=%d) with Terrain=%d"
                          ,(ulong)(uint)grid.x,(ulong)_broken_mon & 0xffffffff,
                          (ulong)_broken_mon >> 0x20,(ulong)psVar2->feat);
      }
      else {
        psVar2 = square((chunk *)c,(loc_conflict)last_bad_obj);
        local_50 = format("Broken Monster:  %d Embedded in Terrain; Last at (x=%d,y=%d) with Terrain=%d"
                          ,(ulong)(uint)grid.y,(ulong)last_bad_obj & 0xffffffff,
                          (ulong)last_bad_obj >> 0x20,(ulong)psVar2->feat);
      }
    }
    else {
      psVar2 = square((chunk *)c,(loc_conflict)last_bad_mon);
      local_50 = format("Broken Wilderness:  %d Bounding Walls; Last at (x=%d,y=%d) with Feature=%d"
                        ,(ulong)(uint)broken_obj,(ulong)last_bad_mon & 0xffffffff,
                        (ulong)last_bad_mon >> 0x20,(ulong)psVar2->feat);
    }
    dump_level_simple((char *)0x0,local_50,c);
    msg("Restarting wilderness generation; bad level in dumpedlevel.html");
    c_local._7_1_ = false;
  }
  return c_local._7_1_;
}

Assistant:

static bool verify_level(struct chunk *c)
{
	struct loc last_bad_bnd = loc(0, 0);
	struct loc last_bad_mon = loc(0, 0);
	struct loc last_bad_obj = loc(0, 0);
	int broken_bnd = 0, broken_mon = 0, broken_obj = 0;
	struct loc grid;

	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			if ((grid.y == 0 || grid.x == 0
					|| grid.y == c->height - 1
					|| grid.x == c->width - 1)
					&& square(c, grid)->feat != FEAT_PERM) {
				++broken_bnd;
				last_bad_bnd = grid;
			}
			if (square_monster(c, grid)
					&& !square_is_monster_walkable(c, grid)) {
				++broken_mon;
				last_bad_mon = grid;
			}
			if (square_object(c, grid)
					&& !square_isobjectholding(c, grid)) {
				++broken_obj;
				last_bad_obj = grid;
			}
		}
	}

	if (broken_bnd || broken_mon || broken_obj) {
		const char *title;

		if (broken_bnd) {
			title = format("Broken Wilderness:  %d Bounding Walls; Last at (x=%d,y=%d) with Feature=%d",
				broken_bnd, last_bad_bnd.x, last_bad_bnd.y,
				(int) square(c, last_bad_bnd)->feat);
		} else if (broken_mon) {
			title = format("Broken Monster:  %d Embedded in Terrain; Last at (x=%d,y=%d) with Terrain=%d",
				broken_mon, last_bad_mon.x, last_bad_mon.y,
				(int) square(c, last_bad_mon)->feat);
		} else {
			title = format("Broken Object:  %d Embedded in Terrain; Last at (x=%d,y=%d) with Terrain=%d",
				broken_obj, last_bad_obj.x, last_bad_obj.y,
				(int) square(c, last_bad_obj)->feat);
		}
		dump_level_simple(NULL, title, c);
		msg("Restarting wilderness generation; bad level in dumpedlevel.html");
		return false;
	}
	return true;
}